

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O3

void __thiscall glcts::CullDistance::FunctionalTest::readTexturePixels(FunctionalTest *this)

{
  pointer puVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  puVar1 = (this->m_to_pixel_data_cache).
           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_to_pixel_data_cache).
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_to_pixel_data_cache).
    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->m_to_pixel_data_cache,(ulong)(this->m_to_width * this->m_to_height * 4));
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0x1220))
            (0,0,this->m_to_width,this->m_to_height,0x1908,0x1403,
             (this->m_to_pixel_data_cache).
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start);
  err = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  glu::checkError(err,"glReadPixels() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                  ,0xb41);
  return;
}

Assistant:

void CullDistance::FunctionalTest::readTexturePixels()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_to_pixel_data_cache.clear();

	m_to_pixel_data_cache.resize(m_to_width * m_to_height * m_to_pixel_data_cache_color_components);

	/* Read vertex from texture */
	gl.readPixels(0,		   /* x      */
				  0,		   /* y      */
				  m_to_width,  /* width  */
				  m_to_height, /* height */
				  GL_RGBA, GL_UNSIGNED_SHORT, &m_to_pixel_data_cache[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");
}